

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

size_t __thiscall efsw::String::find_first_not_of(String *this,char *s,size_t pos)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  String local_38;
  
  String(&local_38,s);
  uVar1 = (this->mString)._M_string_length;
  uVar2 = 0xffffffffffffffff;
  if ((pos < uVar1) && (uVar2 = pos, local_38.mString._M_string_length != 0)) {
    do {
      uVar2 = pos;
      sVar3 = 0;
      while (local_38.mString._M_dataplus._M_p[sVar3] != (this->mString)._M_dataplus._M_p[uVar2]) {
        sVar3 = sVar3 + 1;
        if (local_38.mString._M_string_length == sVar3) goto LAB_0010891e;
      }
      pos = uVar2 + 1;
      uVar2 = 0xffffffffffffffff;
    } while (pos != uVar1);
  }
LAB_0010891e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_38.mString._M_dataplus._M_p != &local_38.mString.field_2) {
    operator_delete(local_38.mString._M_dataplus._M_p);
  }
  return uVar2;
}

Assistant:

std::size_t String::find_first_not_of( const char* s, std::size_t pos ) const {
	return find_first_not_of( String( s ), pos );
}